

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

ans_byte_decode * ans_byte_decode::load(uint8_t *in_u8)

{
  value_type vVar1;
  uint uVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  unsigned_long_long uVar4;
  reference pvVar5;
  uint64_t uVar6;
  ans_byte_decode *in_RDI;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  uint16_t k;
  value_type cur_freq;
  size_t sym_1;
  uint16_t cur_base;
  uint64_t tmp;
  value_type cur;
  size_t sym;
  uint32_t prev;
  array<unsigned_int,_256UL> efreqs;
  uint32_t *in_ptr_u32;
  ans_byte_decode *model;
  size_type in_stack_fffffffffffffb58;
  undefined2 in_stack_fffffffffffffb60;
  uint16_t in_stack_fffffffffffffb62;
  undefined1 in_stack_fffffffffffffb64;
  uint8_t in_stack_fffffffffffffb65;
  ushort in_stack_fffffffffffffb66;
  undefined4 in_stack_fffffffffffffb80;
  value_type in_stack_fffffffffffffb84;
  ushort local_45e;
  ulong local_458;
  ushort local_44a;
  ulong local_438;
  value_type local_430;
  size_t in_stack_fffffffffffffbd8;
  size_t in_stack_fffffffffffffbe0;
  uint32_t *in_stack_fffffffffffffbe8;
  uint32_t *in_stack_fffffffffffffbf0;
  undefined1 extraout_var [56];
  
  ans_byte_decode((ans_byte_decode *)
                  CONCAT26(in_stack_fffffffffffffb66,
                           CONCAT15(in_stack_fffffffffffffb65,
                                    CONCAT14(in_stack_fffffffffffffb64,
                                             CONCAT22(in_stack_fffffffffffffb62,
                                                      in_stack_fffffffffffffb60)))));
  std::array<unsigned_int,_256UL>::data((array<unsigned_int,_256UL> *)0x184008);
  interpolative_internal::decode
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8);
  pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                     ((array<unsigned_int,_256UL> *)
                      CONCAT26(in_stack_fffffffffffffb66,
                               CONCAT15(in_stack_fffffffffffffb65,
                                        CONCAT14(in_stack_fffffffffffffb64,
                                                 CONCAT22(in_stack_fffffffffffffb62,
                                                          in_stack_fffffffffffffb60)))),
                      in_stack_fffffffffffffb58);
  local_430 = *pvVar3;
  for (local_438 = 1; auVar7 = in_ZMM0._0_16_, local_438 < 0x100; local_438 = local_438 + 1) {
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)
                        CONCAT26(in_stack_fffffffffffffb66,
                                 CONCAT15(in_stack_fffffffffffffb65,
                                          CONCAT14(in_stack_fffffffffffffb64,
                                                   CONCAT22(in_stack_fffffffffffffb62,
                                                            in_stack_fffffffffffffb60)))),
                        in_stack_fffffffffffffb58);
    vVar1 = *pvVar3;
    in_stack_fffffffffffffb84 = (vVar1 - local_430) - 1;
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)
                        CONCAT26(in_stack_fffffffffffffb66,
                                 CONCAT15(in_stack_fffffffffffffb65,
                                          CONCAT14(in_stack_fffffffffffffb64,
                                                   CONCAT22(in_stack_fffffffffffffb62,
                                                            in_stack_fffffffffffffb60)))),
                        in_stack_fffffffffffffb58);
    *pvVar3 = in_stack_fffffffffffffb84;
    local_430 = vVar1;
  }
  __first = std::begin<std::array<unsigned_int,256ul>>((array<unsigned_int,_256UL> *)0x1840c4);
  __last = std::end<std::array<unsigned_int,256ul>>((array<unsigned_int,_256UL> *)0x1840d5);
  uVar4 = std::accumulate<unsigned_int*,unsigned_long_long>(__first,__last,0);
  in_RDI->frame_size = uVar4;
  in_RDI->frame_mask = in_RDI->frame_size - 1;
  auVar7 = vcvtusi2sd_avx512f(auVar7,in_RDI->frame_size);
  auVar8._0_8_ = log2(auVar7._0_8_);
  auVar8._8_56_ = extraout_var;
  uVar6 = vcvttsd2usi_avx512f(auVar8._0_16_);
  in_RDI->frame_log2 = uVar6;
  std::vector<dec_entry,_std::allocator<dec_entry>_>::resize
            ((vector<dec_entry,_std::allocator<dec_entry>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),(size_type)__first);
  local_44a = 0;
  for (local_458 = 0; local_458 < 0x100; local_458 = local_458 + 1) {
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)
                        CONCAT26(in_stack_fffffffffffffb66,
                                 CONCAT15(in_stack_fffffffffffffb65,
                                          CONCAT14(in_stack_fffffffffffffb64,
                                                   CONCAT22(in_stack_fffffffffffffb62,
                                                            in_stack_fffffffffffffb60)))),
                        in_stack_fffffffffffffb58);
    uVar2 = *pvVar3;
    for (local_45e = 0; local_45e < uVar2; local_45e = local_45e + 1) {
      in_stack_fffffffffffffb62 = (uint16_t)uVar2;
      pvVar5 = std::vector<dec_entry,_std::allocator<dec_entry>_>::operator[]
                         (&in_RDI->table,(long)(int)((uint)local_44a + (uint)local_45e));
      pvVar5->freq = in_stack_fffffffffffffb62;
      in_stack_fffffffffffffb65 = (uint8_t)local_458;
      pvVar5 = std::vector<dec_entry,_std::allocator<dec_entry>_>::operator[]
                         (&in_RDI->table,(long)(int)((uint)local_44a + (uint)local_45e));
      pvVar5->sym = in_stack_fffffffffffffb65;
      in_stack_fffffffffffffb66 = local_45e;
      pvVar5 = std::vector<dec_entry,_std::allocator<dec_entry>_>::operator[]
                         (&in_RDI->table,(long)(int)((uint)local_44a + (uint)local_45e));
      pvVar5->offset = in_stack_fffffffffffffb66;
    }
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)
                        CONCAT26(in_stack_fffffffffffffb66,
                                 CONCAT15(in_stack_fffffffffffffb65,
                                          CONCAT14(in_stack_fffffffffffffb64,
                                                   CONCAT22(in_stack_fffffffffffffb62,
                                                            in_stack_fffffffffffffb60)))),
                        in_stack_fffffffffffffb58);
    local_44a = local_44a + (short)*pvVar3;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  return in_RDI;
}

Assistant:

static ans_byte_decode load(const uint8_t* in_u8)
    {
        ans_byte_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        std::array<uint32_t, constants::MAX_SIGMA> efreqs;
        interpolative_internal::decode(in_ptr_u32, model.nfreqs.data(),
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);
        uint32_t prev = model.nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            auto cur = model.nfreqs[sym];
            model.nfreqs[sym] = cur - prev - 1;
            prev = cur;
        }
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0ULL);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        uint64_t tmp = constants::K * constants::RADIX;
        uint16_t cur_base = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint16_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].sym = sym;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }